

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

object __thiscall pybind11::cpp_function::name(cpp_function *this)

{
  object_api<pybind11::handle> *in_RSI;
  str_attr_accessor local_38;
  cpp_function *this_local;
  
  this_local = this;
  pybind11::detail::object_api<pybind11::handle>::attr(&local_38,in_RSI,"__name__");
  pybind11::detail::accessor::operator_cast_to_object((accessor *)this);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_38);
  return (object)(handle)this;
}

Assistant:

object name() const { return attr("__name__"); }